

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O1

MPP_RET parse_one_rps(BitReadCtx_t *bitctx,Avs2dRps_t *rps)

{
  MPP_RET MVar1;
  undefined8 in_RAX;
  MPP_RET unaff_EBP;
  MPP_RET MVar2;
  ulong uVar3;
  int iVar4;
  RK_S32 _out;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","In","parse_one_rps");
  }
  MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)((long)&uStack_38 + 4));
  bitctx->ret = MVar1;
  iVar4 = 6;
  if (MVar1 == MPP_OK) {
    rps->refered_by_others = uStack_38._4_1_;
    iVar4 = 0;
  }
  if (iVar4 != 6) {
    if (iVar4 != 0) {
      return unaff_EBP;
    }
    MVar1 = mpp_read_bits(bitctx,3,(RK_S32 *)((long)&uStack_38 + 4));
    bitctx->ret = MVar1;
    iVar4 = 6;
    if (MVar1 == MPP_OK) {
      rps->num_of_ref = uStack_38._4_1_;
      iVar4 = 0;
    }
    if (iVar4 != 6) {
      if (iVar4 != 0) {
        return unaff_EBP;
      }
      if (((byte)avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_ps","refered_by_others_flag %d, num_Of_ref %d","parse_one_rps",
                   (ulong)rps->refered_by_others,(ulong)rps->num_of_ref);
      }
      if (7 < rps->num_of_ref) {
        _mpp_log_l(2,"avs2d_ps","invalid ref num(%d).\n","parse_one_rps");
        if (((byte)avs2d_parse_debug & 8) == 0) {
          return MPP_NOK;
        }
        _mpp_log_l(4,"avs2d_ps","Out Failed\n","parse_one_rps");
        return MPP_NOK;
      }
      if (rps->num_of_ref != '\0') {
        uVar3 = 0;
        do {
          MVar2 = ~MPP_ERR_READ_BIT;
          MVar1 = mpp_read_bits(bitctx,6,(RK_S32 *)((long)&uStack_38 + 4));
          bitctx->ret = MVar1;
          if (MVar1 == MPP_OK) {
            rps->ref_pic[uVar3] = uStack_38._4_1_;
            MVar2 = MPP_OK;
          }
          if (MVar2 != MPP_OK) goto LAB_0018475b;
          if (((byte)avs2d_parse_debug & 8) != 0) {
            _mpp_log_l(4,"avs2d_ps","delta_doi_of_ref_pic[%d]=%d","parse_one_rps",uVar3 & 0xffffffff
                       ,(ulong)rps->ref_pic[uVar3]);
          }
          uVar3 = uVar3 + 1;
          unaff_EBP = MPP_OK;
        } while (uVar3 < rps->num_of_ref);
      }
      MVar1 = mpp_read_bits(bitctx,3,(RK_S32 *)((long)&uStack_38 + 4));
      bitctx->ret = MVar1;
      iVar4 = 6;
      if (MVar1 == MPP_OK) {
        rps->num_to_remove = uStack_38._4_1_;
        iVar4 = 0;
      }
      if (iVar4 != 6) {
        if (iVar4 != 0) {
          return unaff_EBP;
        }
        if (rps->num_to_remove != '\0') {
          uVar3 = 0;
          do {
            MVar2 = ~MPP_ERR_READ_BIT;
            MVar1 = mpp_read_bits(bitctx,6,(RK_S32 *)((long)&uStack_38 + 4));
            bitctx->ret = MVar1;
            if (MVar1 == MPP_OK) {
              rps->remove_pic[uVar3] = uStack_38._4_1_;
              MVar2 = MPP_OK;
            }
            if (MVar2 != MPP_OK) goto LAB_0018475b;
            if (((byte)avs2d_parse_debug & 8) != 0) {
              _mpp_log_l(4,"avs2d_ps","num_of_removed_pic[%d]=%d","parse_one_rps",uVar3 & 0xffffffff
                         ,(ulong)rps->remove_pic[uVar3]);
            }
            uVar3 = uVar3 + 1;
            unaff_EBP = MPP_OK;
          } while (uVar3 < rps->num_to_remove);
        }
        MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)((long)&uStack_38 + 4));
        bitctx->ret = MVar1;
        iVar4 = 6;
        if (((MVar1 == MPP_OK) && (iVar4 = 0, uStack_38._4_1_ != '\x01')) &&
           (iVar4 = 0, ((byte)avs2d_parse_debug & 4) != 0)) {
          iVar4 = 0;
          _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0x10c)
          ;
        }
        if (iVar4 != 6) {
          if (iVar4 != 0) {
            return unaff_EBP;
          }
          if (((byte)avs2d_parse_debug & 8) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"avs2d_ps","Out ret %d\n","parse_one_rps",0);
          return MPP_OK;
        }
      }
    }
  }
LAB_00184760:
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Out Bit read Err\n","parse_one_rps");
  }
  return bitctx->ret;
LAB_0018475b:
  if (MVar2 != ~MPP_ERR_READ_BIT) {
    return MVar2;
  }
  goto LAB_00184760;
}

Assistant:

static MPP_RET parse_one_rps(BitReadCtx_t *bitctx, Avs2dRps_t *rps)
{
    MPP_RET ret = MPP_OK;
    RK_U32 j;

    AVS2D_PARSE_TRACE("In");
    READ_ONEBIT(bitctx, &rps->refered_by_others);

    READ_BITS(bitctx, 3, &rps->num_of_ref);
    AVS2D_PARSE_TRACE("refered_by_others_flag %d, num_Of_ref %d", rps->refered_by_others, rps->num_of_ref);
    if (rps->num_of_ref > AVS2_MAX_REFS) {
        ret = MPP_NOK;
        mpp_err_f("invalid ref num(%d).\n", rps->num_of_ref);
        goto __FAILED;
    }
    for (j = 0; j < rps->num_of_ref; j++) {
        READ_BITS(bitctx, 6, &rps->ref_pic[j]);
        AVS2D_PARSE_TRACE("delta_doi_of_ref_pic[%d]=%d", j, rps->ref_pic[j]);
    }

    READ_BITS(bitctx, 3, &rps->num_to_remove);
    for (j = 0; j < rps->num_to_remove; j++) {
        READ_BITS(bitctx, 6, &rps->remove_pic[j]);
        AVS2D_PARSE_TRACE("num_of_removed_pic[%d]=%d", j, rps->remove_pic[j]);
    }

    READ_MARKER_BIT(bitctx);
    AVS2D_PARSE_TRACE("Out ret %d\n", ret);
    return ret;
__BITREAD_ERR:
    AVS2D_PARSE_TRACE("Out Bit read Err\n");
    return ret = bitctx->ret;
__FAILED:
    AVS2D_PARSE_TRACE("Out Failed\n");
    return ret;
}